

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O2

void __thiscall glslang::TIntermediate::setEntryPointName(TIntermediate *this,char *ep)

{
  std::__cxx11::string::assign((char *)&this->entryPointName);
  TProcesses::addProcess(&this->processes,"entry-point");
  TProcesses::addArgument(&this->processes,&this->entryPointName);
  return;
}

Assistant:

void setEntryPointName(const char* ep)
    {
        entryPointName = ep;
        processes.addProcess("entry-point");
        processes.addArgument(entryPointName);
    }